

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<bool> __thiscall
kj::HttpServer::Connection::sendError
          (Connection *this,uint statusCode,StringPtr statusText,String *body)

{
  undefined8 uVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  undefined4 in_register_00000034;
  HttpHeaderTable *params;
  undefined8 *in_R9;
  HttpOutputStream *this_00;
  Promise<bool> PVar2;
  StringPtr value;
  HttpHeaderId id;
  StringPtr value_00;
  StringPtr statusText_00;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  Disposer *local_b8;
  IdsByNameMap *pIStack_b0;
  Array<char> local_a8;
  HttpHeaders failed;
  
  statusText_00.content.ptr = (char *)statusText.content.size_;
  local_f8._24_8_ = this;
  HttpHeaders::HttpHeaders
            (&failed,*(HttpHeaderTable **)
                      (*(long *)(CONCAT44(in_register_00000034,statusCode) + 8) + 0x10));
  value.content.size_ = extraout_RDX;
  value.content.ptr = (char *)0x6;
  anon_unknown_31::requireValidHeaderValue((anon_unknown_31 *)"close",value);
  ((failed.indexedHeaders.ptr)->content).ptr = "close";
  ((failed.indexedHeaders.ptr)->content).size_ = 6;
  local_d8._0_8_ = (StringPtr *)0x0;
  if (in_R9[1] != 0) {
    local_d8._0_8_ = (StringPtr *)(in_R9[1] + -1);
  }
  params = (HttpHeaderTable *)local_d8;
  str<unsigned_long>((String *)local_f8,(unsigned_long *)params);
  id._8_8_ = 5;
  id.table = params;
  HttpHeaders::set(&failed,id,(String *)local_f8);
  Array<char>::~Array((Array<char> *)local_f8);
  value_00.content.size_ = extraout_RDX_00;
  value_00.content.ptr = &DAT_0000000b;
  anon_unknown_31::requireValidHeaderValue((anon_unknown_31 *)"text/plain",value_00);
  failed.indexedHeaders.ptr[0xe].content.ptr = "text/plain";
  failed.indexedHeaders.ptr[0xe].content.size_ = 0xb;
  local_b8 = (Disposer *)0x0;
  pIStack_b0 = (IdsByNameMap *)0x0;
  statusText_00.content.size_ = (size_t)body;
  HttpHeaders::serializeResponse
            ((String *)(local_d8 + 8),&failed,(uint)statusText.content.ptr,statusText_00,
             (ArrayPtr<const_kj::StringPtr>)ZEXT816(0));
  this_00 = (HttpOutputStream *)(CONCAT44(in_register_00000034,statusCode) + 0xe8);
  anon_unknown_31::HttpOutputStream::writeHeaders(this_00,(String *)(local_d8 + 8));
  Array<char>::~Array((Array<char> *)(local_d8 + 8));
  local_a8.ptr = (char *)*in_R9;
  local_a8.size_ = in_R9[1];
  local_a8.disposer = (ArrayDisposer *)in_R9[2];
  *in_R9 = 0;
  in_R9[1] = 0;
  anon_unknown_31::HttpOutputStream::writeBodyData(this_00,(String *)&local_a8);
  Array<char>::~Array(&local_a8);
  anon_unknown_31::HttpOutputStream::finishBody(this_00);
  anon_unknown_31::HttpOutputStream::flush((HttpOutputStream *)local_f8);
  uVar1 = local_f8._24_8_;
  Promise<void>::
  then<kj::HttpServer::Connection::sendError(unsigned_int,kj::StringPtr,kj::String)::_lambda()_1_,kj::_::PropagateException>
            ((Promise<void> *)local_f8._24_8_,(anon_class_1_0_00000001_for_func *)local_f8,
             (PropagateException *)local_d8);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_f8);
  HttpHeaders::~HttpHeaders(&failed);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX_01;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)uVar1;
  return (Promise<bool>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> sendError(uint statusCode, kj::StringPtr statusText, kj::String body) {
    HttpHeaders failed(server.requestHeaderTable);
    failed.set(HttpHeaderId::CONNECTION, "close");
    failed.set(HttpHeaderId::CONTENT_LENGTH, kj::str(body.size()));

    failed.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

    httpOutput.writeHeaders(failed.serializeResponse(statusCode, statusText));
    httpOutput.writeBodyData(kj::mv(body));
    httpOutput.finishBody();
    return httpOutput.flush().then([]() { return false; });  // loop ends after flush
  }